

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodDescriptorProto::Clear(MethodDescriptorProto *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_15a;
  byte local_159;
  LogMessage local_158;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  MethodDescriptorProto *local_50;
  MethodDescriptorProto *this_local;
  InternalMetadataWithArena *local_40;
  InternalMetadataWithArena *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_50 = this;
  if ((local_18->has_bits_[0] & 0xf) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_,psVar2);
      local_89 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d70);
        local_89 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_9d,pLVar3);
      }
      if ((local_89 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_88);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_input_type(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->input_type_,psVar2);
      local_d9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d74);
        local_d9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_d8,
                            "CHECK failed: !input_type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_da,pLVar3);
      }
      if ((local_d9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_d8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->input_type_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_output_type(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->output_type_,psVar2);
      local_119 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_118,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d78);
        local_119 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_118,
                            "CHECK failed: !output_type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_11a,pLVar3);
      }
      if ((local_119 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_118);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->output_type_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if (bVar1) {
      local_159 = 0;
      if (this->options_ == (MethodOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_158,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d7c);
        local_159 = 1;
        pLVar3 = internal::LogMessage::operator<<(&local_158,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_15a,pLVar3);
      }
      if ((local_159 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_158);
      }
      MethodOptions::Clear(this->options_);
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0x30) != 0) {
    memset(&this->client_streaming_,0,2);
  }
  this_local = (MethodDescriptorProto *)&this->_has_bits_;
  memset(this_local,0,4);
  local_40 = &this->_internal_metadata_;
  if (((uint)(local_40->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_38 = local_40;
    local_10 = local_40;
    internal::InternalMetadataWithArena::DoClear(local_40);
  }
  return;
}

Assistant:

void MethodDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.MethodDescriptorProto)
  if (_has_bits_[0 / 32] & 15u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_input_type()) {
      GOOGLE_DCHECK(!input_type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*input_type_.UnsafeRawStringPointer())->clear();
    }
    if (has_output_type()) {
      GOOGLE_DCHECK(!output_type_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*output_type_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::MethodOptions::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 48u) {
    ::memset(&client_streaming_, 0, reinterpret_cast<char*>(&server_streaming_) -
      reinterpret_cast<char*>(&client_streaming_) + sizeof(server_streaming_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}